

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O1

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeCube>::TPZCompElHCurl
          (TPZCompElHCurl<pzshape::TPZShapeCube> *this,TPZCompMesh *mesh,
          TPZCompElHCurl<pzshape::TPZShapeCube> *copy)

{
  long *__s;
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeCube>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_019736c0;
  TPZIntelGen<pzshape::TPZShapeCube>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapeCube>,&PTR_PTR_0196f1b0,mesh,
             &copy->super_TPZIntelGen<pzshape::TPZShapeCube>);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeCube>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElHCurl_0196ede0;
  TPZVec<long>::TPZVec(&(this->fConnectIndexes).super_TPZVec<long>,0);
  (this->fConnectIndexes).super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_018e54c8;
  __s = (this->fConnectIndexes).fExtAlloc;
  (this->fConnectIndexes).super_TPZVec<long>.fStore = __s;
  (this->fConnectIndexes).super_TPZVec<long>.fNElements = 0x13;
  (this->fConnectIndexes).super_TPZVec<long>.fNAlloc = 0;
  memset(__s,0xff,0x98);
  this->fhcurlfam = copy->fhcurlfam;
  return;
}

Assistant:

TPZCompElHCurl<TSHAPE>::TPZCompElHCurl(TPZCompMesh &mesh, const TPZCompElHCurl<TSHAPE> &copy) :
TPZRegisterClassId(&TPZCompElHCurl::ClassId),
TPZIntelGen<TSHAPE>(mesh,copy), fhcurlfam(copy.fhcurlfam)
{

}